

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmik.cpp
# Opt level: O1

void __thiscall lmik::solve(lmik *this,Vector2d *q_ref,Vector2d *X_ref)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  ActualDstType actualDst;
  SrcEvaluatorType srcEvaluator_1;
  double dVar4;
  double dVar5;
  Matrix2d W_N;
  SrcEvaluatorType srcEvaluator;
  Matrix2d J;
  Vector2d e;
  Vector2d g;
  Matrix2d H;
  assign_op<double,_double> local_141;
  double local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  Vector2d *local_f0;
  SrcXprType local_e8;
  double *local_e0;
  Matrix2d local_d8;
  double local_b8;
  double dStack_b0;
  Matrix<double,_2,_2,_0,_2,_2> local_a8;
  double *local_88;
  Matrix<double,_2,_2,_0,_2,_2> *local_80;
  double *local_78;
  undefined8 local_70;
  double local_68;
  double dStack_60;
  Matrix2d local_58;
  
  dVar3 = (q_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array[0];
  dVar1 = (q_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array[1];
  local_f0 = q_ref;
  do {
    local_138._8_4_ = SUB84(dVar1,0);
    local_138._0_8_ = dVar3;
    local_138._12_4_ = (int)((ulong)dVar1 >> 0x20);
    dVar1 = (X_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[0];
    local_140 = cos(dVar3);
    dVar3 = local_138._8_8_ + (double)local_138._0_8_;
    local_128._8_4_ = local_138._8_4_;
    local_128._0_8_ = dVar3;
    local_128._12_4_ = local_138._12_4_;
    dVar3 = cos(dVar3);
    local_b8 = dVar1 - (local_140 * 0.1 + dVar3 * 0.1);
    dVar3 = (X_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[1];
    local_140 = sin((double)local_138._0_8_);
    dVar1 = sin((double)local_128._0_8_);
    dStack_b0 = dVar3 - (local_140 * 0.1 + dVar1 * 0.1);
    dVar3 = sin((double)local_138._0_8_);
    dVar1 = sin((double)local_128._0_8_);
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0]
         = dVar3 * -0.1 + dVar1 * -0.1;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
         = sin((double)local_128._0_8_);
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
         = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
           array[2] * -0.1;
    dVar3 = cos((double)local_138._0_8_);
    dVar1 = cos((double)local_128._0_8_);
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1]
         = dVar3 * 0.1 + dVar1 * 0.1;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
         = cos((double)local_128._0_8_);
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
         = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
           array[3] * 0.1;
    dVar3 = (this->W_E).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[0];
    dVar1 = (this->W_E).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[1];
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0]
         = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
           array[1] * dVar1 +
           local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
           array[0] * dVar3;
    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1]
         = dVar1 * local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[3] +
           dVar3 * local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[2];
    dVar3 = (this->W_E).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[2];
    dVar1 = (this->W_E).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[3];
    local_68 = dStack_b0 *
               (local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                m_data.array[0] * dVar3 +
               local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
               m_data.array[1] * dVar1) +
               local_b8 *
               local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
               m_data.array[0];
    dStack_60 = dStack_b0 *
                (local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                 m_data.array[2] * dVar3 +
                local_d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                m_data.array[3] * dVar1) +
                local_b8 *
                local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                m_data.array[1];
    dVar3 = dStack_b0 * dStack_b0 + local_b8 * local_b8;
    dVar1 = (this->W_N_bar).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[1] + dVar3 * 0.0;
    local_118._8_4_ = SUB84(dVar1,0);
    local_118._0_8_ =
         (this->W_N_bar).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
         m_data.array[0] + dVar3;
    local_118._12_4_ = (int)((ulong)dVar1 >> 0x20);
    dVar1 = (this->W_N_bar).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[3] + dVar3;
    local_108._8_4_ = SUB84(dVar1,0);
    local_108._0_8_ =
         (this->W_N_bar).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
         m_data.array[2] + dVar3 * 0.0;
    local_108._12_4_ = (int)((ulong)dVar1 >> 0x20);
    cal_H(this,&local_58,&local_d8,(Matrix2d *)local_118);
    local_e0 = &local_68;
    local_e8.m_xpr = &local_58;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Inverse<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_a8,&local_e8,&local_141);
    local_88 = local_e0;
    local_70 = 2;
    dVar4 = local_e0[1] *
            local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[2] +
            *local_e0 *
            local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0];
    dVar5 = local_e0[1] *
            local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[3] +
            *local_e0 *
            local_a8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[1];
    dVar3 = (double)local_138._0_8_ + dVar4;
    dVar1 = (double)local_138._8_8_ + dVar5;
    if (ABS(dVar4) <= this->threshold) break;
    local_80 = &local_a8;
    local_78 = local_88;
  } while (this->threshold < ABS(dVar5));
  auVar2._8_4_ = SUB84(dVar1,0);
  auVar2._0_8_ = dVar3;
  auVar2._12_4_ = (int)((ulong)dVar1 >> 0x20);
  *(undefined1 (*) [16])
   (local_f0->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array =
       auVar2;
  return;
}

Assistant:

void lmik::solve(Vector2d& q_ref, const Vector2d& X_ref) {
    Matrix2d W_N, J, H;
    Vector2d q, q_new, delta_q, e, g; 
    q = q_ref;
    
    do {
        cal_e(e, q, X_ref);
        cal_J(J, q);
        cal_g(g, J, e);
        cal_W_N(W_N, e);
        cal_H(H, J, W_N);
        delta_q = H.inverse() * g;
        q += delta_q;
    } while(abs(delta_q(0)) > threshold && abs(delta_q(1)) > threshold);

    q_ref = q;
    return;
}